

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O1

bool __thiscall crnlib::Resampler::put_line(Resampler *this,Sample *Psrc)

{
  int iVar1;
  Sample *pSVar2;
  ulong uVar3;
  
  iVar1 = this->m_cur_src_y;
  if (this->m_resample_src_y <= iVar1) {
    return false;
  }
  if (this->m_Psrc_y_count[iVar1] == 0) {
    this->m_cur_src_y = iVar1 + 1;
  }
  else {
    uVar3 = 0;
    do {
      if (this->m_Pscan_buf->scan_buf_y[uVar3] == -1) goto LAB_0015268b;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x4000);
    uVar3 = 0x4000;
LAB_0015268b:
    if ((int)uVar3 == 0x4000) {
      this->m_status = STATUS_SCAN_BUFFER_FULL;
      return false;
    }
    this->m_Psrc_y_flag[iVar1] = '\x01';
    uVar3 = uVar3 & 0xffffffff;
    this->m_Pscan_buf->scan_buf_y[uVar3] = this->m_cur_src_y;
    if (this->m_Pscan_buf->scan_buf_l[uVar3] == (Sample *)0x0) {
      pSVar2 = (Sample *)crnlib_malloc((long)this->m_intermediate_x << 2);
      this->m_Pscan_buf->scan_buf_l[uVar3] = pSVar2;
      if (pSVar2 == (Sample *)0x0) {
        this->m_status = STATUS_OUT_OF_MEMORY;
        return false;
      }
    }
    pSVar2 = this->m_Pscan_buf->scan_buf_l[uVar3];
    if (this->m_delay_x_resample == true) {
      memcpy(pSVar2,Psrc,(long)this->m_intermediate_x << 2);
    }
    else {
      resample_x(this,pSVar2,Psrc);
    }
    this->m_cur_src_y = this->m_cur_src_y + 1;
  }
  return true;
}

Assistant:

bool Resampler::put_line(const Sample* Psrc) {
  int i;

  if (m_cur_src_y >= m_resample_src_y)
    return false;

  /* Does this source line contribute
      * to any destination line? if not,
      * exit now.
      */

  if (!m_Psrc_y_count[resampler_range_check(m_cur_src_y, m_resample_src_y)]) {
    m_cur_src_y++;
    return true;
  }

  /* Find an empty slot in the scanline buffer. (FIXME: Perf. is terrible here with extreme scaling ratios.) */

  for (i = 0; i < MAX_SCAN_BUF_SIZE; i++)
    if (m_Pscan_buf->scan_buf_y[i] == -1)
      break;

  /* If the buffer is full, exit with an error. */

  if (i == MAX_SCAN_BUF_SIZE) {
    m_status = STATUS_SCAN_BUFFER_FULL;
    return false;
  }

  m_Psrc_y_flag[resampler_range_check(m_cur_src_y, m_resample_src_y)] = TRUE;
  m_Pscan_buf->scan_buf_y[i] = m_cur_src_y;

  /* Does this slot have any memory allocated to it? */

  if (!m_Pscan_buf->scan_buf_l[i]) {
    if ((m_Pscan_buf->scan_buf_l[i] = (Sample*)crnlib_malloc(m_intermediate_x * sizeof(Sample))) == NULL) {
      m_status = STATUS_OUT_OF_MEMORY;
      return false;
    }
  }

  // Resampling on the X axis first?
  if (m_delay_x_resample) {
    resampler_assert(m_intermediate_x == m_resample_src_x);

    // Y-X resampling order
    memcpy(m_Pscan_buf->scan_buf_l[i], Psrc, m_intermediate_x * sizeof(Sample));
  } else {
    resampler_assert(m_intermediate_x == m_resample_dst_x);

    // X-Y resampling order
    resample_x(m_Pscan_buf->scan_buf_l[i], Psrc);
  }

  m_cur_src_y++;

  return true;
}